

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

void gl4cts::MultiBind::checkBinding
               (Context *context,GLenum pname,GLuint index,string *target_name,GLint expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  TestError *this_01;
  MessageBuilder local_1b8;
  int local_34;
  long lStack_30;
  GLint binding;
  Functions *gl;
  string *psStack_20;
  GLint expected_value_local;
  string *target_name_local;
  GLuint index_local;
  GLenum pname_local;
  Context *context_local;
  
  gl._4_4_ = expected_value;
  psStack_20 = target_name;
  target_name_local._0_4_ = index;
  target_name_local._4_4_ = pname;
  _index_local = context;
  pRVar2 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = -1;
  (**(code **)(lStack_30 + 0x860))(target_name_local._4_4_,(GLuint)target_name_local,&local_34);
  err = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(err,"GetIntegeri_v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x582);
  if (local_34 != gl._4_4_) {
    this = deqp::Context::getTestContext(_index_local);
    this_00 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [18])"Invalid binding: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])0x2a22899);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&gl + 4));
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [11])0x29be45a);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,psStack_20);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b29eab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&target_name_local);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x589);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void checkBinding(deqp::Context& context, GLenum pname, GLuint index, const std::string& target_name,
				  GLint expected_value)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	GLint binding = -1;

	gl.getIntegeri_v(pname, index, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegeri_v");

	if (binding != expected_value)
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid binding: " << binding
										  << ", expected: " << expected_value << ". Target: " << target_name
										  << " at index: " << index << tcu::TestLog::EndMessage;
		TCU_FAIL("Invalid binding");
	}
}